

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

wchar_t edit_pathname(bsdtar_conflict *bsdtar,archive_entry *entry)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  char *in_RAX;
  byte *pbVar4;
  char *pcVar5;
  wchar_t wVar6;
  byte bVar7;
  byte *pbVar8;
  byte *pbVar9;
  bool bVar10;
  char *subst_name;
  
  subst_name = in_RAX;
  pbVar4 = (byte *)archive_entry_pathname(entry);
  iVar3 = apply_substitution((bsdtar *)bsdtar,(char *)pbVar4,&subst_name,0,0);
  if (iVar3 == 1) {
    archive_entry_copy_pathname(entry,subst_name);
    cVar2 = *subst_name;
    free(subst_name);
    if (cVar2 == '\0') {
      return L'\xffffffff';
    }
    pbVar4 = (byte *)archive_entry_pathname(entry);
  }
  else if (iVar3 == -1) {
    lafe_warnc(0,"Invalid substitution, skipping entry");
    return L'\x01';
  }
  pcVar5 = archive_entry_hardlink(entry);
  if (pcVar5 == (char *)0x0) {
LAB_00111a37:
    pcVar5 = archive_entry_symlink(entry);
    if (pcVar5 != (char *)0x0) {
      pcVar5 = archive_entry_symlink(entry);
      iVar3 = apply_substitution((bsdtar *)bsdtar,pcVar5,&subst_name,1,0);
      if (iVar3 == 1) {
        archive_entry_copy_symlink(entry,subst_name);
        free(subst_name);
      }
      else if (iVar3 == -1) goto LAB_00111a6e;
    }
    if (L'\0' < bsdtar->strip_components) {
      pcVar5 = archive_entry_hardlink(entry);
      wVar6 = bsdtar->strip_components;
      pbVar4 = (byte *)strip_components((char *)pbVar4,wVar6);
      if (pbVar4 == (byte *)0x0) {
        return L'\x01';
      }
      if (pcVar5 != (char *)0x0) {
        pcVar5 = strip_components(pcVar5,wVar6);
        if (pcVar5 == (char *)0x0) {
          return L'\x01';
        }
        archive_entry_copy_hardlink(entry,pcVar5);
      }
    }
    bVar7 = *pbVar4;
    if (bsdtar->option_absolute_paths == '\0') {
      bVar10 = true;
      pbVar9 = pbVar4;
      if ((((bVar7 == 0x5c) || (bVar7 == 0x2f)) && ((pbVar4[1] == 0x5c || (pbVar4[1] == 0x2f)))) &&
         (((bVar7 = pbVar4[2], bVar7 == 0x3f || (bVar7 == 0x2e)) &&
          ((pbVar4[3] == 0x5c || (pbVar4[3] == 0x2f)))))) {
        if (((((bVar7 == 0x3f) && ((pbVar4[4] | 0x20) == 0x75)) && ((pbVar4[5] | 0x20) == 0x6e)) &&
            ((pbVar4[6] | 0x20) == 99)) && ((pbVar4[7] == 0x5c || (pbVar4[7] == 0x2f)))) {
          pbVar9 = pbVar4 + 8;
        }
        else {
          pbVar9 = pbVar4 + 4;
        }
        bVar10 = false;
      }
      bVar7 = *pbVar9;
      do {
        pbVar8 = pbVar9;
        pbVar1 = pbVar8;
        if (((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a) &&
           (pbVar1 = pbVar8 + (ulong)(pbVar8[1] == 0x3a) * 2, pbVar8[1] == 0x3a)) {
          bVar10 = false;
        }
        while ((pbVar9 = pbVar1, bVar7 = *pbVar9, bVar7 == 0x5c || (bVar7 == 0x2f))) {
          pbVar1 = pbVar9 + 1;
          if (((pbVar9[1] == 0x2e) && (pbVar9[2] == 0x2e)) &&
             ((pbVar9[3] == 0x2f || (pbVar9[3] == 0x5c)))) {
            pbVar1 = pbVar9 + 3;
            bVar10 = false;
          }
        }
      } while (pbVar9 != pbVar8);
      if ((pbVar8 != pbVar4) && (bsdtar->warned_lead_slash == '\0')) {
        if (bVar10) {
          lafe_warnc(0,"Removing leading \'%c\' from member names");
        }
        else {
          lafe_warnc(0,"Removing leading drive letter from member names");
        }
        bsdtar->warned_lead_slash = '\x01';
        bVar7 = *pbVar9;
      }
      if (bVar7 == 0) {
        pbVar9 = (byte *)0x16c525;
      }
    }
    else {
      bVar10 = bVar7 == 0x2f;
      do {
        pbVar9 = pbVar4;
        if (!bVar10) break;
        bVar10 = true;
        pbVar4 = pbVar9 + 1;
      } while (pbVar9[1] == 0x2f);
    }
    pbVar4 = (byte *)archive_entry_pathname(entry);
    wVar6 = L'\0';
    if (pbVar9 != pbVar4) {
      pcVar5 = strdup((char *)pbVar9);
      archive_entry_copy_pathname(entry,pcVar5);
      free(pcVar5);
    }
  }
  else {
    pcVar5 = archive_entry_hardlink(entry);
    iVar3 = apply_substitution((bsdtar *)bsdtar,pcVar5,&subst_name,0,1);
    if (iVar3 == 1) {
      archive_entry_copy_hardlink(entry,subst_name);
      free(subst_name);
      goto LAB_00111a37;
    }
    if (iVar3 != -1) goto LAB_00111a37;
LAB_00111a6e:
    wVar6 = L'\x01';
    lafe_warnc(0,"Invalid substitution, skipping entry");
  }
  return wVar6;
}

Assistant:

int
edit_pathname(struct bsdtar *bsdtar, struct archive_entry *entry)
{
	const char *name = archive_entry_pathname(entry);
#if defined(HAVE_REGEX_H) || defined(HAVE_PCREPOSIX_H)
	char *subst_name;
	int r;

	r = apply_substitution(bsdtar, name, &subst_name, 0, 0);
	if (r == -1) {
		lafe_warnc(0, "Invalid substitution, skipping entry");
		return 1;
	}
	if (r == 1) {
		archive_entry_copy_pathname(entry, subst_name);
		if (*subst_name == '\0') {
			free(subst_name);
			return -1;
		} else
			free(subst_name);
		name = archive_entry_pathname(entry);
	}

	if (archive_entry_hardlink(entry)) {
		r = apply_substitution(bsdtar, archive_entry_hardlink(entry), &subst_name, 0, 1);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_hardlink(entry, subst_name);
			free(subst_name);
		}
	}
	if (archive_entry_symlink(entry) != NULL) {
		r = apply_substitution(bsdtar, archive_entry_symlink(entry), &subst_name, 1, 0);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_symlink(entry, subst_name);
			free(subst_name);
		}
	}
#endif

	/* Strip leading dir names as per --strip-components option. */
	if (bsdtar->strip_components > 0) {
		const char *linkname = archive_entry_hardlink(entry);

		name = strip_components(name, bsdtar->strip_components);
		if (name == NULL)
			return (1);

		if (linkname != NULL) {
			linkname = strip_components(linkname,
			    bsdtar->strip_components);
			if (linkname == NULL)
				return (1);
			archive_entry_copy_hardlink(entry, linkname);
		}
	}

	/* By default, don't write or restore absolute pathnames. */
	if (!bsdtar->option_absolute_paths) {
		const char *rp, *p = name;
		int slashonly = 1;

		/* Remove leading "//./" or "//?/" or "//?/UNC/"
		 * (absolute path prefixes used by Windows API) */
		if ((p[0] == '/' || p[0] == '\\') &&
		    (p[1] == '/' || p[1] == '\\') &&
		    (p[2] == '.' || p[2] == '?') &&
		    (p[3] == '/' || p[3] == '\\'))
		{
			if (p[2] == '?' &&
			    (p[4] == 'U' || p[4] == 'u') &&
			    (p[5] == 'N' || p[5] == 'n') &&
			    (p[6] == 'C' || p[6] == 'c') &&
			    (p[7] == '/' || p[7] == '\\'))
				p += 8;
			else
				p += 4;
			slashonly = 0;
		}
		do {
			rp = p;
			/* Remove leading drive letter from archives created
			 * on Windows. */
			if (((p[0] >= 'a' && p[0] <= 'z') ||
			     (p[0] >= 'A' && p[0] <= 'Z')) &&
				 p[1] == ':') {
				p += 2;
				slashonly = 0;
			}
			/* Remove leading "/../", "//", etc. */
			while (p[0] == '/' || p[0] == '\\') {
				if (p[1] == '.' && p[2] == '.' &&
					(p[3] == '/' || p[3] == '\\')) {
					p += 3; /* Remove "/..", leave "/"
							 * for next pass. */
					slashonly = 0;
				} else
					p += 1; /* Remove "/". */
			}
		} while (rp != p);

		if (p != name && !bsdtar->warned_lead_slash) {
			/* Generate a warning the first time this happens. */
			if (slashonly)
				lafe_warnc(0,
				    "Removing leading '%c' from member names",
				    name[0]);
			else
				lafe_warnc(0,
				    "Removing leading drive letter from "
				    "member names");
			bsdtar->warned_lead_slash = 1;
		}

		/* Special case: Stripping everything yields ".". */
		if (*p == '\0')
			name = ".";
		else
			name = p;
	} else {
		/* Strip redundant leading '/' characters. */
		while (name[0] == '/' && name[1] == '/')
			name++;
	}

	/* Safely replace name in archive_entry. */
	if (name != archive_entry_pathname(entry)) {
		char *q = strdup(name);
		archive_entry_copy_pathname(entry, q);
		free(q);
	}
	return (0);
}